

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.cpp
# Opt level: O1

Fp multiply(Fp *a,Fp *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  Fp FVar7;
  
  uVar4 = a->frac & 0xffffffff;
  uVar5 = a->frac >> 0x20;
  uVar1 = b->frac & 0xffffffff;
  uVar2 = uVar1 * uVar5;
  uVar6 = b->frac >> 0x20;
  uVar3 = uVar6 * uVar4;
  FVar7.frac = ((uVar1 * uVar4 >> 0x20) + (uVar3 & 0xffffffff) + (uVar2 & 0xffffffff) + 0x80000000
               >> 0x20) + (uVar3 >> 0x20) + (uVar2 >> 0x20) + uVar6 * uVar5;
  FVar7.exp = b->exp + a->exp + 0x40;
  FVar7._12_4_ = 0;
  return FVar7;
}

Assistant:

static Fp multiply(Fp* a, Fp* b) {
  const uint64_t lomask = 0x00000000FFFFFFFF;

  uint64_t ah_bl = (a->frac >> 32) * (b->frac & lomask);
  uint64_t al_bh = (a->frac & lomask) * (b->frac >> 32);
  uint64_t al_bl = (a->frac & lomask) * (b->frac & lomask);
  uint64_t ah_bh = (a->frac >> 32) * (b->frac >> 32);

  uint64_t tmp = (ah_bl & lomask) + (al_bh & lomask) + (al_bl >> 32);
  /* round up */
  tmp += 1U << 31;

  Fp fp = {ah_bh + (ah_bl >> 32) + (al_bh >> 32) + (tmp >> 32),
           a->exp + b->exp + 64};

  return fp;
}